

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_0::BlittingImages::copyRegionToTextureLevel
          (BlittingImages *this,ConstPixelBufferAccess src,PixelBufferAccess dst,CopyRegion region)

{
  VkFilter VVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  PixelBufferAccess *in_RDX;
  uint height;
  int iVar5;
  ConstPixelBufferAccess *in_RSI;
  ConstPixelBufferAccess *__return_storage_ptr__;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  MirrorMode mirrorMode;
  int iVar9;
  int iVar10;
  FilterMode filter;
  VkOffset3D regionOffset;
  VkOffset3D regionOffset_00;
  VkOffset3D regionExtent;
  VkOffset3D regionExtent_00;
  ConstPixelBufferAccess srcSubRegion;
  PixelBufferAccess unclampedSubRegion;
  FilterMode in_stack_fffffffffffffe78;
  ConstPixelBufferAccess local_120;
  ConstPixelBufferAccess local_f8;
  ConstPixelBufferAccess local_d0;
  ConstPixelBufferAccess local_a8;
  PixelBufferAccess local_80;
  PixelBufferAccess local_58;
  
  bVar4 = 3;
  bVar2 = 3;
  if (((src.m_pitch.m_data[0] < (int)src.m_data || src.m_size.m_data[2] < src.m_pitch.m_data[2]) &&
      (bVar2 = 0,
      (int)src.m_data < src.m_pitch.m_data[0] || src.m_pitch.m_data[2] < src.m_size.m_data[2])) &&
     (bVar2 = 2,
     src.m_pitch.m_data[0] < (int)src.m_data || src.m_pitch.m_data[2] < src.m_size.m_data[2])) {
    bVar2 = (src.m_size.m_data[2] < src.m_pitch.m_data[2] || (int)src.m_data < src.m_pitch.m_data[0]
            ) * '\x03' + 1;
  }
  if (((dst.super_ConstPixelBufferAccess.m_pitch.m_data[0] <
        (int)dst.super_ConstPixelBufferAccess.m_data ||
        dst.super_ConstPixelBufferAccess.m_size.m_data[2] <
        dst.super_ConstPixelBufferAccess.m_pitch.m_data[2]) &&
      (bVar4 = 0,
      (int)dst.super_ConstPixelBufferAccess.m_data <
      dst.super_ConstPixelBufferAccess.m_pitch.m_data[0] ||
      dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] <
      dst.super_ConstPixelBufferAccess.m_size.m_data[2])) &&
     (bVar4 = 2,
     dst.super_ConstPixelBufferAccess.m_pitch.m_data[0] <
     (int)dst.super_ConstPixelBufferAccess.m_data ||
     dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] <
     dst.super_ConstPixelBufferAccess.m_size.m_data[2])) {
    bVar4 = (dst.super_ConstPixelBufferAccess.m_size.m_data[2] <
             dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] ||
            (int)dst.super_ConstPixelBufferAccess.m_data <
            dst.super_ConstPixelBufferAccess.m_pitch.m_data[0]) * '\x03' + 1;
  }
  mirrorMode = MIRROR_MODE_NONE;
  if ((((bVar2 != bVar4) && ((mirrorMode = MIRROR_MODE_Y, bVar2 != 3 || (bVar4 != 1)))) &&
      ((bVar2 != 1 || (bVar4 != 3)))) &&
     (((bVar2 != 2 || (bVar4 != 0)) && ((bVar2 != 0 || (bVar4 != 2)))))) {
    mirrorMode = MIRROR_MODE_X;
    if ((((bVar4 != 1 || bVar2 != 0) && (bVar2 != 1 || bVar4 != 0)) &&
        (bVar4 != 2 || (bVar2 ^ 3) != 0)) && (bVar2 != 2 || (bVar4 ^ 3) != 0)) {
      mirrorMode = MIRROR_MODE_LAST -
                   (bVar2 == 0 && (bVar4 ^ 3) == 0 || (bVar2 ^ 3) == 0 && bVar4 == 0);
    }
  }
  iVar5 = dst.super_ConstPixelBufferAccess.m_pitch.m_data[0];
  if (mirrorMode - MIRROR_MODE_X < 3) {
    iVar9 = src.m_size.m_data[2];
    if (src.m_pitch.m_data[2] < src.m_size.m_data[2]) {
      iVar9 = src.m_pitch.m_data[2];
    }
    iVar10 = src.m_pitch.m_data[0];
    if ((int)src.m_data < src.m_pitch.m_data[0]) {
      iVar10 = (int)src.m_data;
    }
    if (src.m_pitch.m_data[2] < src.m_size.m_data[2]) {
      src.m_pitch.m_data[2] = src.m_size.m_data[2];
    }
    if ((int)src.m_data < src.m_pitch.m_data[0]) {
      src.m_data._0_4_ = src.m_pitch.m_data[0];
    }
    iVar6 = dst.super_ConstPixelBufferAccess.m_size.m_data[2];
    if (dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] <
        dst.super_ConstPixelBufferAccess.m_size.m_data[2]) {
      iVar6 = dst.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    }
    if ((int)dst.super_ConstPixelBufferAccess.m_data <
        dst.super_ConstPixelBufferAccess.m_pitch.m_data[0]) {
      iVar5 = (int)dst.super_ConstPixelBufferAccess.m_data;
    }
    if (dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] <
        dst.super_ConstPixelBufferAccess.m_size.m_data[2]) {
      dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
           dst.super_ConstPixelBufferAccess.m_size.m_data[2];
    }
    src.m_size.m_data[2] = iVar9;
    src.m_pitch.m_data[0] = iVar10;
    dst.super_ConstPixelBufferAccess.m_size.m_data[2] = iVar6;
    if ((int)dst.super_ConstPixelBufferAccess.m_data <
        dst.super_ConstPixelBufferAccess.m_pitch.m_data[0]) {
      dst.super_ConstPixelBufferAccess.m_data._0_4_ =
           dst.super_ConstPixelBufferAccess.m_pitch.m_data[0];
    }
  }
  dst.super_ConstPixelBufferAccess.m_pitch.m_data[0] = iVar5;
  regionOffset_00.y = src.m_pitch.m_data[0];
  regionOffset_00.x = src.m_size.m_data[2];
  iVar10 = src.m_pitch.m_data[2] - src.m_size.m_data[2];
  iVar5 = (int)src.m_data - src.m_pitch.m_data[0];
  iVar9 = dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] -
          dst.super_ConstPixelBufferAccess.m_size.m_data[2];
  height = (int)dst.super_ConstPixelBufferAccess.m_data -
           dst.super_ConstPixelBufferAccess.m_pitch.m_data[0];
  VVar1 = (this->super_CopiesAndBlittingTestInstance).m_params.field_3.filter;
  uVar7 = (ulong)(VVar1 == VK_FILTER_LINEAR);
  bVar3 = tcu::isCombinedDepthStencilType((in_RSI->m_format).type);
  filter = (FilterMode)(VVar1 == VK_FILTER_LINEAR);
  if (bVar3) {
    bVar3 = tcu::hasDepthComponent((in_RSI->m_format).order);
    if (bVar3) {
      tcu::getSubregion(&local_f8,in_RSI,src.m_size.m_data[2],src.m_pitch.m_data[0],iVar10,iVar5);
      tcu::getEffectiveDepthStencilAccess(&local_d0,&local_f8,MODE_DEPTH);
      tcu::getSubregion((PixelBufferAccess *)&local_120,in_RDX,
                        dst.super_ConstPixelBufferAccess.m_size.m_data[2],
                        dst.super_ConstPixelBufferAccess.m_pitch.m_data[0],iVar9,height);
      tcu::getEffectiveDepthStencilAccess
                ((PixelBufferAccess *)&local_f8,(PixelBufferAccess *)&local_120,MODE_DEPTH);
      tcu::scale((PixelBufferAccess *)&local_f8,&local_d0,filter);
      if (VVar1 == VK_FILTER_LINEAR) {
        tcu::getEffectiveDepthStencilAccess(&local_120,in_RSI,MODE_DEPTH);
        tcu::TextureLevel::getAccess
                  (&local_80,
                   (this->m_unclampedExpectedTextureLevel).
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        uVar7 = (ulong)height;
        tcu::getSubregion(&local_58,&local_80,dst.super_ConstPixelBufferAccess.m_size.m_data[2],
                          dst.super_ConstPixelBufferAccess.m_pitch.m_data[0],iVar9,height);
        tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)&local_a8,&local_58,MODE_DEPTH);
        regionExtent.y = 0;
        regionExtent.x = filter;
        regionOffset.z = iVar10;
        regionOffset.x = src.m_size.m_data[2];
        regionOffset.y = src.m_pitch.m_data[0];
        regionExtent.z = (deInt32)uVar7;
        scaleFromWholeSrcBuffer
                  ((PixelBufferAccess *)&local_a8,&local_120,regionOffset,regionExtent,
                   in_stack_fffffffffffffe78);
      }
    }
    bVar3 = tcu::hasStencilComponent((in_RSI->m_format).order);
    if (!bVar3) {
      return;
    }
    tcu::getSubregion(&local_f8,in_RSI,src.m_size.m_data[2],src.m_pitch.m_data[0],iVar10,iVar5);
    tcu::getEffectiveDepthStencilAccess(&local_d0,&local_f8,MODE_STENCIL);
    tcu::getSubregion((PixelBufferAccess *)&local_120,in_RDX,
                      dst.super_ConstPixelBufferAccess.m_size.m_data[2],
                      dst.super_ConstPixelBufferAccess.m_pitch.m_data[0],iVar9,height);
    tcu::getEffectiveDepthStencilAccess
              ((PixelBufferAccess *)&local_f8,(PixelBufferAccess *)&local_120,MODE_STENCIL);
    uVar7 = (ulong)filter;
    blit((PixelBufferAccess *)&local_f8,&local_d0,filter,mirrorMode);
    if (VVar1 != VK_FILTER_LINEAR) {
      return;
    }
    tcu::getEffectiveDepthStencilAccess(&local_120,in_RSI,MODE_STENCIL);
    tcu::TextureLevel::getAccess
              (&local_80,
               (this->m_unclampedExpectedTextureLevel).
               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
               ptr);
    uVar8 = (ulong)height;
    tcu::getSubregion(&local_58,&local_80,dst.super_ConstPixelBufferAccess.m_size.m_data[2],
                      dst.super_ConstPixelBufferAccess.m_pitch.m_data[0],iVar9,height);
    __return_storage_ptr__ = &local_a8;
    tcu::getEffectiveDepthStencilAccess
              ((PixelBufferAccess *)__return_storage_ptr__,&local_58,MODE_STENCIL);
    in_RSI = &local_120;
  }
  else {
    tcu::getSubregion(&local_d0,in_RSI,src.m_size.m_data[2],src.m_pitch.m_data[0],iVar10,iVar5);
    tcu::getSubregion((PixelBufferAccess *)&local_f8,in_RDX,
                      dst.super_ConstPixelBufferAccess.m_size.m_data[2],
                      dst.super_ConstPixelBufferAccess.m_pitch.m_data[0],iVar9,height);
    blit((PixelBufferAccess *)&local_f8,&local_d0,filter,mirrorMode);
    if (VVar1 != VK_FILTER_LINEAR) {
      return;
    }
    tcu::TextureLevel::getAccess
              ((PixelBufferAccess *)&local_a8,
               (this->m_unclampedExpectedTextureLevel).
               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
               ptr);
    __return_storage_ptr__ = &local_120;
    uVar8 = (ulong)height;
    tcu::getSubregion((PixelBufferAccess *)__return_storage_ptr__,(PixelBufferAccess *)&local_a8,
                      dst.super_ConstPixelBufferAccess.m_size.m_data[2],
                      dst.super_ConstPixelBufferAccess.m_pitch.m_data[0],iVar9,height);
  }
  regionOffset_00.z = iVar10;
  regionExtent_00.z = (deInt32)uVar8;
  regionExtent_00.x = (int)uVar7;
  regionExtent_00.y = (int)(uVar7 >> 0x20);
  scaleFromWholeSrcBuffer
            ((PixelBufferAccess *)__return_storage_ptr__,in_RSI,regionOffset_00,regionExtent_00,
             in_stack_fffffffffffffe78);
  return;
}

Assistant:

void BlittingImages::copyRegionToTextureLevel (tcu::ConstPixelBufferAccess src, tcu::PixelBufferAccess dst, CopyRegion region)
{
	const MirrorMode mirrorMode = getMirrorMode(region.imageBlit.srcOffsets[0],
												region.imageBlit.srcOffsets[1],
												region.imageBlit.dstOffsets[0],
												region.imageBlit.dstOffsets[1]);

	flipCoordinates(region, mirrorMode);

	const VkOffset3D					srcOffset		= region.imageBlit.srcOffsets[0];
	const VkOffset3D					srcExtent		=
	{
		region.imageBlit.srcOffsets[1].x - srcOffset.x,
		region.imageBlit.srcOffsets[1].y - srcOffset.y,
		region.imageBlit.srcOffsets[1].z - srcOffset.z
	};
	const VkOffset3D					dstOffset		= region.imageBlit.dstOffsets[0];
	const VkOffset3D					dstExtent		=
	{
		region.imageBlit.dstOffsets[1].x - dstOffset.x,
		region.imageBlit.dstOffsets[1].y - dstOffset.y,
		region.imageBlit.dstOffsets[1].z - dstOffset.z
	};
	const tcu::Sampler::FilterMode		filter			= (m_params.filter == VK_FILTER_LINEAR) ? tcu::Sampler::LINEAR : tcu::Sampler::NEAREST;

	if (tcu::isCombinedDepthStencilType(src.getFormat().type))
	{
		DE_ASSERT(src.getFormat() == dst.getFormat());
		// Scale depth.
		if (tcu::hasDepthComponent(src.getFormat().order))
		{
			const tcu::ConstPixelBufferAccess	srcSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(src, srcOffset.x, srcOffset.y, srcExtent.x, srcExtent.y), tcu::Sampler::MODE_DEPTH);
			const tcu::PixelBufferAccess		dstSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(dst, dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_DEPTH);
			tcu::scale(dstSubRegion, srcSubRegion, filter);

			if (filter == tcu::Sampler::LINEAR)
			{
				const tcu::ConstPixelBufferAccess	depthSrc			= getEffectiveDepthStencilAccess(src, tcu::Sampler::MODE_DEPTH);
				const tcu::PixelBufferAccess		unclampedSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(m_unclampedExpectedTextureLevel->getAccess(), dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_DEPTH);
				scaleFromWholeSrcBuffer(unclampedSubRegion, depthSrc, srcOffset, srcExtent, filter);
			}
		}

		// Scale stencil.
		if (tcu::hasStencilComponent(src.getFormat().order))
		{
			const tcu::ConstPixelBufferAccess	srcSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(src, srcOffset.x, srcOffset.y, srcExtent.x, srcExtent.y), tcu::Sampler::MODE_STENCIL);
			const tcu::PixelBufferAccess		dstSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(dst, dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_STENCIL);
			blit(dstSubRegion, srcSubRegion, filter, mirrorMode);

			if (filter == tcu::Sampler::LINEAR)
			{
				const tcu::ConstPixelBufferAccess	stencilSrc			= getEffectiveDepthStencilAccess(src, tcu::Sampler::MODE_STENCIL);
				const tcu::PixelBufferAccess		unclampedSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(m_unclampedExpectedTextureLevel->getAccess(), dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_STENCIL);
				scaleFromWholeSrcBuffer(unclampedSubRegion, stencilSrc, srcOffset, srcExtent, filter);
			}
		}
	}
	else
	{
		const tcu::ConstPixelBufferAccess	srcSubRegion	= tcu::getSubregion(src, srcOffset.x, srcOffset.y, srcExtent.x, srcExtent.y);
		const tcu::PixelBufferAccess		dstSubRegion	= tcu::getSubregion(dst, dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y);
		blit(dstSubRegion, srcSubRegion, filter, mirrorMode);

		if (filter == tcu::Sampler::LINEAR)
		{
			const tcu::PixelBufferAccess	unclampedSubRegion	= tcu::getSubregion(m_unclampedExpectedTextureLevel->getAccess(), dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y);
			scaleFromWholeSrcBuffer(unclampedSubRegion, src, srcOffset, srcExtent, filter);
		}
	}
}